

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
          (basic_appender<char> out,unsigned_long value,format_specs *specs)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  unsigned_long uVar5;
  buffer<char> *buf;
  long lVar6;
  bool bVar7;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_68;
  char local_58 [64];
  
  sVar3 = 2;
  uVar5 = value;
  do {
    sVar2 = sVar3;
    sVar3 = sVar2 + 1;
    bVar7 = 0xf < uVar5;
    uVar5 = uVar5 >> 4;
  } while (bVar7);
  local_68.num_digits = (int)sVar2 - 1;
  local_68.value = value;
  if (specs == (format_specs *)0x0) {
    uVar4 = sVar3 + (out.container)->size_;
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    uVar4 = (out.container)->size_ + 1;
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    sVar3 = (out.container)->size_;
    (out.container)->size_ = sVar3 + 1;
    (out.container)->ptr_[sVar3] = '0';
    uVar4 = (out.container)->size_ + 1;
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    uVar5 = local_68.value;
    sVar3 = (out.container)->size_;
    (out.container)->size_ = sVar3 + 1;
    (out.container)->ptr_[sVar3] = 'x';
    lVar6 = (long)local_68.num_digits;
    pcVar1 = to_pointer<char>(out,(ulong)(uint)local_68.num_digits);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = local_58 + lVar6 + -1;
      do {
        *pcVar1 = "0123456789abcdef"[(uint)uVar5 & 0xf];
        pcVar1 = pcVar1 + -1;
        bVar7 = 0xf < uVar5;
        uVar5 = uVar5 >> 4;
      } while (bVar7);
      out = copy_noinline<char,char*,fmt::v11::basic_appender<char>>(local_58,local_58 + lVar6,out);
    }
    else {
      pcVar1 = pcVar1 + lVar6;
      do {
        pcVar1 = pcVar1 + -1;
        *pcVar1 = "0123456789abcdef"[(uint)uVar5 & 0xf];
        bVar7 = 0xf < uVar5;
        uVar5 = uVar5 >> 4;
      } while (bVar7);
    }
  }
  else {
    out = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>(fmt::v11::basic_appender<char>,unsigned_long,fmt::v11::format_specs_const*)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                    (out,specs,sVar3,sVar3,&local_68);
  }
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value, const format_specs* specs)
    -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_base2e<Char>(4, it, value, num_digits);
  };
  return specs ? write_padded<Char, align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}